

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<double&,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<double&,std::integral_constant<unsigned_long,1ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<double&>,ranges::variant<double&,double&>>,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (long n,undefined8 *self,undefined8 param_3,undefined8 param_4)

{
  int iVar1;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = param_3;
  local_8 = param_4;
  if (n != 0) {
    iVar1 = variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<double&,std::integral_constant<unsigned_long,1ul>>>,true>::type_const,ranges::detail::variant_visitor<ranges::detail::unique_visitor<ranges::variant<double&>,ranges::variant<double&,double&>>,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
                      (n + -1);
    return iVar1;
  }
  variant_visitor<ranges::detail::unique_visitor<ranges::variant<double&>,ranges::variant<double&,double&>>,ranges::variant<void,void>>
  ::operator()((variant_visitor<ranges::detail::unique_visitor<ranges::variant<double&>,ranges::variant<double&,double&>>,ranges::variant<void,void>>
                *)&local_10,(add_pointer_t<double_&>)*self);
  return 0;
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }